

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

If_DsdObj_t * If_DsdObjAlloc(If_DsdMan_t *p,int Type,int nFans)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  If_DsdObj_t *pObj_00;
  If_DsdObj_t *pObj;
  int nWords;
  int nFans_local;
  int Type_local;
  If_DsdMan_t *p_local;
  
  iVar1 = If_DsdObjWordNum(nFans);
  pObj_00 = (If_DsdObj_t *)Mem_FlexEntryFetch(p->pMem,iVar1 << 3);
  If_DsdObjClean(pObj_00);
  *(uint *)&pObj_00->field_0x4 = *(uint *)&pObj_00->field_0x4 & 0xfffffff8 | Type & 7U;
  *(uint *)&pObj_00->field_0x4 = *(uint *)&pObj_00->field_0x4 & 0x7ffffff | nFans << 0x1b;
  uVar2 = Vec_PtrSize(&p->vObjs);
  pObj_00->Id = uVar2;
  *(uint *)&pObj_00->field_0x4 =
       *(uint *)&pObj_00->field_0x4 & 0xfffffeff | (p->fNewAsUseless & 1U) << 8;
  *(uint *)&pObj_00->field_0x4 = *(uint *)&pObj_00->field_0x4 & 0xf80001ff;
  Vec_PtrPush(&p->vObjs,pObj_00);
  Vec_IntPush(&p->vNexts,0);
  Vec_IntPush(&p->vTruths,-1);
  iVar1 = Vec_IntSize(&p->vNexts);
  iVar3 = Vec_PtrSize(&p->vObjs);
  if (iVar1 != iVar3) {
    __assert_fail("Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x104,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
  }
  iVar1 = Vec_IntSize(&p->vTruths);
  iVar3 = Vec_PtrSize(&p->vObjs);
  if (iVar1 == iVar3) {
    return pObj_00;
  }
  __assert_fail("Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x105,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
}

Assistant:

If_DsdObj_t * If_DsdObjAlloc( If_DsdMan_t * p, int Type, int nFans )
{
    int nWords = If_DsdObjWordNum( nFans );
    If_DsdObj_t * pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * nWords );
    If_DsdObjClean( pObj );
    pObj->Type   = Type;
    pObj->nFans  = nFans;
    pObj->Id     = Vec_PtrSize( &p->vObjs );
    pObj->fMark  = p->fNewAsUseless;
    pObj->Count  = 0;
    Vec_PtrPush( &p->vObjs, pObj );
    Vec_IntPush( &p->vNexts, 0 );
    Vec_IntPush( &p->vTruths, -1 );
    assert( Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs) );
    assert( Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs) );
    return pObj;
}